

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::on_mouse_down(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                *this,unsigned_long btn,unsigned_long state,long x,long y,bool is_double_click)

{
  data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *pdVar1;
  ulong uVar2;
  bool bVar3;
  rectangle *prVar4;
  bool *pbVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  _Head_base<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_false>
  _Var9;
  
  prVar4 = scrollable_region::display_rect(&this->super_scrollable_region);
  bVar3 = rectangle::contains(prVar4,x,y);
  if ((((btn != 1) || (!bVar3)) || ((this->super_scrollable_region).super_drawable.enabled != true))
     || ((this->super_scrollable_region).super_drawable.hidden != false)) {
    return;
  }
  if (((state & 0x18) == 0) || (this->ms_enabled == false)) {
    (this->items)._at_start = true;
    (this->items).pos =
         (data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
          *)0x0;
    while (bVar3 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                   ::move_next(&this->items), bVar3) {
      ((this->items).pos)->is_selected = false;
    }
  }
  prVar4 = scrollable_region::total_rect(&this->super_scrollable_region);
  pdVar1 = (this->items).array_elements;
  pbVar5 = &pdVar1->is_selected;
  uVar7 = 0;
  lVar8 = 0;
  while( true ) {
    if ((this->items).array_size == uVar7) goto LAB_00298a54;
    lVar8 = lVar8 + *(unsigned_long *)(pbVar5 + 0x10);
    if (y - prVar4->t <= lVar8) break;
    uVar7 = uVar7 + 1;
    pbVar5 = pbVar5 + 0x38;
  }
  if (this->ms_enabled == true) {
    if ((state & 0x10) != 0) {
      bVar3 = *pbVar5;
      *pbVar5 = (bool)(bVar3 ^ 1);
      if (bVar3 == false) {
        this->last_selected = uVar7;
      }
      goto LAB_00298a54;
    }
    if ((state & 8) != 0) {
      uVar2 = this->last_selected;
      uVar6 = uVar2;
      if (uVar2 < uVar7) {
        uVar6 = uVar7;
        uVar7 = uVar2;
      }
      pbVar5 = &pdVar1[uVar7].is_selected;
      for (; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
        *pbVar5 = true;
        pbVar5 = pbVar5 + 0x38;
      }
LAB_00298a54:
      base_window::invalidate_rectangle
                (&((this->super_scrollable_region).super_drawable.parent)->super_base_window,
                 &(this->super_scrollable_region).super_drawable.rect);
      return;
    }
  }
  *pbVar5 = true;
  this->last_selected = uVar7;
  if (((is_double_click) &&
      (_Var9._M_head_impl =
            (this->event_handler).data._M_t.
            super___uniq_ptr_impl<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
            .
            super__Head_base<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_false>
            ._M_head_impl, _Var9._M_head_impl != (Tbase<void_(unsigned_long)> *)0x0)) ||
     (_Var9._M_head_impl =
           (this->single_click_event_handler).data._M_t.
           super___uniq_ptr_impl<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
           .
           super__Head_base<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_false>
           ._M_head_impl, _Var9._M_head_impl != (Tbase<void_(unsigned_long)> *)0x0)) {
    (*(_Var9._M_head_impl)->_vptr_Tbase[2])();
  }
  goto LAB_00298a54;
}

Assistant:

void list_box<S>::
    on_mouse_down (
        unsigned long btn,
        unsigned long state,
        long x,
        long y,
        bool is_double_click
    )
    {
        if (display_rect().contains(x,y) && btn == base_window::LEFT && enabled && !hidden )
        {
            if ( ms_enabled == false || 
                 ((!(state&base_window::CONTROL)) && !(state&base_window::SHIFT)))
            {
                items.reset();
                while (items.move_next())
                {
                    items.element().is_selected = false;
                }
            }

            y -= total_rect().top();
            long h = 0;
            for (unsigned long i = 0; i < items.size(); ++i)
            {
                h += items[i].height;
                if (h >= y)
                {
                    if (ms_enabled)
                    {
                        if (state&base_window::CONTROL)
                        {
                            items[i].is_selected = !items[i].is_selected;
                            if (items[i].is_selected)
                                last_selected = i;
                        }
                        else if (state&base_window::SHIFT)
                        {
                            // we want to select everything between (and including) the
                            // current thing clicked and last_selected.
                            const unsigned long first = std::min(i,last_selected);
                            const unsigned long last = std::max(i,last_selected);
                            for (unsigned long j = first; j <= last; ++j)
                                items[j].is_selected = true;
                        }
                        else
                        {
                            items[i].is_selected = true;
                            last_selected = i;
                            if (is_double_click && event_handler.is_set())
                                event_handler(i);
                            else if (single_click_event_handler.is_set())
                                single_click_event_handler(i);
                        }
                    }
                    else
                    {
                        items[i].is_selected = true;
                        last_selected = i;
                        if (is_double_click && event_handler.is_set())
                            event_handler(i);
                        else if (single_click_event_handler.is_set())
                            single_click_event_handler(i);
                    }

                    break;
                }
            }

            parent.invalidate_rectangle(rect);
        }
    }